

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O0

void __thiscall FParser::OPmultiply(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  undefined1 local_58 [8];
  svalue_t right;
  svalue_t left;
  int stop_local;
  int n_local;
  int start_local;
  svalue_t *result_local;
  FParser *this_local;
  
  svalue_t::svalue_t((svalue_t *)&right.value);
  svalue_t::svalue_t((svalue_t *)local_58);
  EvaluateExpression(this,(svalue_t *)&right.value,start,n + -1);
  EvaluateExpression(this,(svalue_t *)local_58,n + 1,stop);
  if ((right.value.i == 6) || (local_58._0_4_ == 6)) {
    dVar3 = floatvalue((svalue_t *)&right.value);
    dVar4 = floatvalue((svalue_t *)local_58);
    svalue_t::setDouble(result,dVar3 * dVar4);
  }
  else {
    result->type = 1;
    iVar1 = intvalue((svalue_t *)&right.value);
    iVar2 = intvalue((svalue_t *)local_58);
    (result->value).i = iVar1 * iVar2;
  }
  svalue_t::~svalue_t((svalue_t *)local_58);
  svalue_t::~svalue_t((svalue_t *)&right.value);
  return;
}

Assistant:

void FParser::OPmultiply(svalue_t &result,int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
	// haleyjd: 8-17
	if(left.type == svt_fixed || right.type == svt_fixed)
	{
		result.setDouble(floatvalue(left) * floatvalue(right));
	}
	else
	{
		result.type = svt_int;
		result.value.i = intvalue(left) * intvalue(right);
	}
}